

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O3

edata_t * duckdb_je_edata_heap_first(edata_heap_t *ph)

{
  edata_t *peVar1;
  ulong uVar2;
  ulong uVar3;
  edata_t *peVar4;
  edata_t *peVar5;
  edata_t *peVar6;
  edata_t *peVar7;
  edata_t *peVar8;
  edata_t *peVar9;
  
  peVar1 = (edata_t *)(ph->ph).root;
  if (peVar1 != (edata_t *)0x0) {
    (ph->ph).auxcount = 0;
    peVar7 = (peVar1->field_5).ql_link_active.qre_prev;
    if (peVar7 != (edata_t *)0x0) {
      (peVar1->field_5).ql_link_active.qre_next = (edata_t *)0x0;
      (peVar1->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
      (peVar7->field_5).ql_link_active.qre_next = (edata_t *)0x0;
      peVar6 = (peVar7->field_5).ql_link_active.qre_prev;
      if (peVar6 != (edata_t *)0x0) {
        peVar9 = (peVar6->field_5).ql_link_active.qre_prev;
        if (peVar9 != (edata_t *)0x0) {
          (peVar9->field_5).ql_link_active.qre_next = (edata_t *)0x0;
        }
        (peVar7->field_5).ql_link_active.qre_next = (edata_t *)0x0;
        (peVar7->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
        (peVar6->field_5).ql_link_active.qre_next = (edata_t *)0x0;
        (peVar6->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
        uVar2 = peVar7->e_sn;
        uVar3 = peVar6->e_sn;
        if ((int)(((uint)(uVar2 >= uVar3 && uVar2 != uVar3) - (uint)(uVar2 < uVar3)) * 2 -
                 (uint)(peVar7->e_addr < peVar6->e_addr)) < 0) {
          (peVar6->field_5).ql_link_active.qre_next = peVar7;
          peVar8 = *(edata_t **)((long)&peVar7->field_5 + 0x10);
          (peVar6->field_5).ql_link_active.qre_prev = peVar8;
          if (peVar8 != (edata_t *)0x0) {
            (peVar8->field_5).ql_link_active.qre_next = peVar6;
          }
          *(edata_t **)((long)&peVar7->field_5 + 0x10) = peVar6;
          peVar6 = peVar7;
        }
        else {
          (peVar7->field_5).ql_link_active.qre_next = peVar6;
          peVar8 = *(edata_t **)((long)&peVar6->field_5 + 0x10);
          (peVar7->field_5).ql_link_active.qre_prev = peVar8;
          if (peVar8 != (edata_t *)0x0) {
            (peVar8->field_5).ql_link_active.qre_next = peVar7;
          }
          *(edata_t **)((long)&peVar6->field_5 + 0x10) = peVar7;
          peVar7 = peVar6;
        }
        while (peVar8 = peVar9, peVar9 = peVar7, peVar8 != (edata_t *)0x0) {
          peVar4 = (peVar8->field_5).ql_link_active.qre_prev;
          if (peVar4 == (edata_t *)0x0) {
            (peVar7->field_5).ql_link_active.qre_prev = peVar8;
            peVar9 = peVar8;
            break;
          }
          peVar9 = (peVar4->field_5).ql_link_active.qre_prev;
          if (peVar9 != (edata_t *)0x0) {
            (peVar9->field_5).ql_link_active.qre_next = (edata_t *)0x0;
          }
          (peVar8->field_5).ql_link_active.qre_next = (edata_t *)0x0;
          (peVar8->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
          (peVar4->field_5).ql_link_active.qre_next = (edata_t *)0x0;
          (peVar4->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
          uVar2 = peVar8->e_sn;
          uVar3 = peVar4->e_sn;
          if ((int)(((uint)(uVar2 >= uVar3 && uVar2 != uVar3) - (uint)(uVar2 < uVar3)) * 2 -
                   (uint)(peVar8->e_addr < peVar4->e_addr)) < 0) {
            (peVar4->field_5).ql_link_active.qre_next = peVar8;
            peVar5 = *(edata_t **)((long)&peVar8->field_5 + 0x10);
            (peVar4->field_5).ql_link_active.qre_prev = peVar5;
            if (peVar5 != (edata_t *)0x0) {
              (peVar5->field_5).ql_link_active.qre_next = peVar4;
            }
            *(edata_t **)((long)&peVar8->field_5 + 0x10) = peVar4;
          }
          else {
            (peVar8->field_5).ql_link_active.qre_next = peVar4;
            peVar5 = *(edata_t **)((long)&peVar4->field_5 + 0x10);
            (peVar8->field_5).ql_link_active.qre_prev = peVar5;
            if (peVar5 != (edata_t *)0x0) {
              (peVar5->field_5).ql_link_active.qre_next = peVar8;
            }
            *(edata_t **)((long)&peVar4->field_5 + 0x10) = peVar8;
            peVar8 = peVar4;
          }
          (peVar7->field_5).ql_link_active.qre_prev = peVar8;
          peVar7 = peVar8;
        }
        peVar8 = (peVar6->field_5).ql_link_active.qre_prev;
        peVar7 = peVar6;
        if (peVar8 != (edata_t *)0x0) {
          while( true ) {
            peVar4 = (peVar8->field_5).ql_link_active.qre_prev;
            (peVar6->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
            (peVar8->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
            uVar2 = peVar6->e_sn;
            uVar3 = peVar8->e_sn;
            if ((int)(((uint)(uVar2 >= uVar3 && uVar2 != uVar3) - (uint)(uVar2 < uVar3)) * 2 -
                     (uint)(peVar6->e_addr < peVar8->e_addr)) < 0) {
              (peVar8->field_5).ql_link_active.qre_next = peVar6;
              peVar7 = *(edata_t **)((long)&peVar6->field_5 + 0x10);
              (peVar8->field_5).ql_link_active.qre_prev = peVar7;
              if (peVar7 != (edata_t *)0x0) {
                (peVar7->field_5).ql_link_active.qre_next = peVar8;
              }
              *(edata_t **)((long)&peVar6->field_5 + 0x10) = peVar8;
              peVar7 = peVar6;
            }
            else {
              (peVar6->field_5).ql_link_active.qre_next = peVar8;
              peVar7 = *(edata_t **)((long)&peVar8->field_5 + 0x10);
              (peVar6->field_5).ql_link_active.qre_prev = peVar7;
              if (peVar7 != (edata_t *)0x0) {
                (peVar7->field_5).ql_link_active.qre_next = peVar6;
              }
              *(edata_t **)((long)&peVar8->field_5 + 0x10) = peVar6;
              peVar7 = peVar8;
            }
            if (peVar4 == (edata_t *)0x0) break;
            (peVar9->field_5).ql_link_active.qre_prev = peVar7;
            peVar8 = (peVar4->field_5).ql_link_active.qre_prev;
            peVar6 = peVar4;
            peVar9 = peVar7;
          }
        }
      }
      (peVar7->field_5).ql_link_active.qre_next = peVar1;
      peVar6 = *(edata_t **)((long)&peVar1->field_5 + 0x10);
      (peVar7->field_5).ql_link_active.qre_prev = peVar6;
      if (peVar6 != (edata_t *)0x0) {
        (peVar6->field_5).ql_link_active.qre_next = peVar7;
      }
      *(edata_t **)((long)&peVar1->field_5 + 0x10) = peVar7;
    }
  }
  return peVar1;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void *
ph_first(ph_t *ph, size_t offset, ph_cmp_t cmp) {
	if (ph->root == NULL) {
		return NULL;
	}
	ph_merge_aux(ph, offset, cmp);
	return ph->root;
}